

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

int loadjitmodule(lua_State *L)

{
  int iVar1;
  char *__s1;
  char *msg;
  lua_State *L_local;
  
  lua_getfield(L,0xffffd8ee,"require");
  lua_pushlstring(L,"jit.",4);
  lua_pushvalue(L,0xfffffffd);
  lua_concat(L,2);
  iVar1 = lua_pcall(L,1,1,0);
  if (iVar1 == 0) {
    lua_getfield(L,0xffffffff,"start");
    iVar1 = lua_type(L,0xffffffff);
    if (iVar1 != 0) {
      lua_remove(L,0xfffffffe);
      return 0;
    }
  }
  else {
    __s1 = (char *)lua_tolstring(L,0xffffffff,0);
    if ((__s1 == (char *)0x0) || (iVar1 = strncmp(__s1,"module ",7), iVar1 != 0)) {
      iVar1 = report(L,1);
      return iVar1;
    }
  }
  l_message(progname,"unknown luaJIT command or jit.* modules not installed");
  return 1;
}

Assistant:

static int loadjitmodule(lua_State *L)
{
  lua_getglobal(L, "require");
  lua_pushliteral(L, "jit.");
  lua_pushvalue(L, -3);
  lua_concat(L, 2);
  if (lua_pcall(L, 1, 1, 0)) {
    const char *msg = lua_tostring(L, -1);
    if (msg && !strncmp(msg, "module ", 7))
      goto nomodule;
    return report(L, 1);
  }
  lua_getfield(L, -1, "start");
  if (lua_isnil(L, -1)) {
  nomodule:
    l_message(progname,
	      "unknown luaJIT command or jit.* modules not installed");
    return 1;
  }
  lua_remove(L, -2);  /* Drop module table. */
  return 0;
}